

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# EbmlUnicodeString.cpp
# Opt level: O2

UTFstring * __thiscall libebml::UTFstring::operator=(UTFstring *this,wchar_t *_aBuf)

{
  ulong uVar1;
  ulong uVar2;
  wchar_t *pwVar3;
  
  if (this->_Data != (wchar_t *)0x0) {
    operator_delete__(this->_Data);
  }
  if (_aBuf == (wchar_t *)0x0) {
    pwVar3 = (wchar_t *)operator_new__(4);
    this->_Data = pwVar3;
  }
  else {
    uVar2 = 0;
    do {
      uVar1 = uVar2;
      uVar2 = uVar1 + 1;
    } while (_aBuf[uVar1] != L'\0');
    this->_Length = uVar1;
    pwVar3 = (wchar_t *)operator_new__(-(ulong)(uVar2 >> 0x3e != 0) | uVar2 * 4);
    this->_Data = pwVar3;
    for (; *_aBuf != L'\0'; _aBuf = _aBuf + 1) {
      *pwVar3 = *_aBuf;
      pwVar3 = pwVar3 + 1;
    }
  }
  *pwVar3 = L'\0';
  UpdateFromUCS2(this);
  return this;
}

Assistant:

UTFstring & UTFstring::operator=(const wchar_t * _aBuf)
{
  delete [] _Data;
  if (_aBuf == NULL) {
    _Data = new wchar_t[1];
    _Data[0] = 0;
    UpdateFromUCS2();
    return *this;
  }

  size_t aLen;
  for (aLen=0; _aBuf[aLen] != 0; aLen++);
  _Length = aLen;
  _Data = new wchar_t[_Length+1];
  for (aLen=0; _aBuf[aLen] != 0; aLen++) {
    _Data[aLen] = _aBuf[aLen];
  }
  _Data[aLen] = 0;
  UpdateFromUCS2();
  return *this;
}